

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O0

auto_ptr<cmCryptoHash> __thiscall cmCryptoHash::New(cmCryptoHash *this,char *algo)

{
  int iVar1;
  cmCryptoHash *pcVar2;
  auto_ptr<cmCryptoHash> local_d8;
  cmCryptoHash *local_d0;
  auto_ptr<cmCryptoHash> local_c8;
  cmCryptoHash *local_c0;
  auto_ptr<cmCryptoHash> local_b8;
  cmCryptoHash *local_b0;
  auto_ptr<cmCryptoHash> local_a8;
  cmCryptoHash *local_a0;
  auto_ptr<cmCryptoHash> local_98;
  cmCryptoHash *local_90;
  auto_ptr<cmCryptoHash> local_88;
  cmCryptoHash *local_80;
  auto_ptr<cmCryptoHash> local_78;
  cmCryptoHash *local_70;
  auto_ptr<cmCryptoHash> local_68;
  cmCryptoHash *local_60;
  auto_ptr<cmCryptoHash> local_58;
  cmCryptoHash *local_50;
  auto_ptr<cmCryptoHash> local_48;
  cmCryptoHash *local_40;
  auto_ptr<cmCryptoHash> local_28;
  cmCryptoHash *local_20;
  char *local_18;
  char *algo_local;
  
  local_18 = algo;
  algo_local = (char *)this;
  iVar1 = strcmp(algo,"MD5");
  if (iVar1 == 0) {
    pcVar2 = (cmCryptoHash *)operator_new(0x10);
    cmCryptoHash(pcVar2,AlgoMD5);
    ::cm::auto_ptr<cmCryptoHash>::auto_ptr(&local_28,pcVar2);
    local_20 = (cmCryptoHash *)::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_28);
    ::cm::auto_ptr<cmCryptoHash>::auto_ptr
              ((auto_ptr<cmCryptoHash> *)this,(auto_ptr_ref<cmCryptoHash>)local_20);
    ::cm::auto_ptr<cmCryptoHash>::~auto_ptr(&local_28);
  }
  else {
    iVar1 = strcmp(local_18,"SHA1");
    if (iVar1 == 0) {
      pcVar2 = (cmCryptoHash *)operator_new(0x10);
      cmCryptoHash(pcVar2,AlgoSHA1);
      ::cm::auto_ptr<cmCryptoHash>::auto_ptr(&local_48,pcVar2);
      local_40 = (cmCryptoHash *)
                 ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_48);
      ::cm::auto_ptr<cmCryptoHash>::auto_ptr
                ((auto_ptr<cmCryptoHash> *)this,(auto_ptr_ref<cmCryptoHash>)local_40);
      ::cm::auto_ptr<cmCryptoHash>::~auto_ptr(&local_48);
    }
    else {
      iVar1 = strcmp(local_18,"SHA224");
      if (iVar1 == 0) {
        pcVar2 = (cmCryptoHash *)operator_new(0x10);
        cmCryptoHash(pcVar2,AlgoSHA224);
        ::cm::auto_ptr<cmCryptoHash>::auto_ptr(&local_58,pcVar2);
        local_50 = (cmCryptoHash *)
                   ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_58);
        ::cm::auto_ptr<cmCryptoHash>::auto_ptr
                  ((auto_ptr<cmCryptoHash> *)this,(auto_ptr_ref<cmCryptoHash>)local_50);
        ::cm::auto_ptr<cmCryptoHash>::~auto_ptr(&local_58);
      }
      else {
        iVar1 = strcmp(local_18,"SHA256");
        if (iVar1 == 0) {
          pcVar2 = (cmCryptoHash *)operator_new(0x10);
          cmCryptoHash(pcVar2,AlgoSHA256);
          ::cm::auto_ptr<cmCryptoHash>::auto_ptr(&local_68,pcVar2);
          local_60 = (cmCryptoHash *)
                     ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_68);
          ::cm::auto_ptr<cmCryptoHash>::auto_ptr
                    ((auto_ptr<cmCryptoHash> *)this,(auto_ptr_ref<cmCryptoHash>)local_60);
          ::cm::auto_ptr<cmCryptoHash>::~auto_ptr(&local_68);
        }
        else {
          iVar1 = strcmp(local_18,"SHA384");
          if (iVar1 == 0) {
            pcVar2 = (cmCryptoHash *)operator_new(0x10);
            cmCryptoHash(pcVar2,AlgoSHA384);
            ::cm::auto_ptr<cmCryptoHash>::auto_ptr(&local_78,pcVar2);
            local_70 = (cmCryptoHash *)
                       ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_78);
            ::cm::auto_ptr<cmCryptoHash>::auto_ptr
                      ((auto_ptr<cmCryptoHash> *)this,(auto_ptr_ref<cmCryptoHash>)local_70);
            ::cm::auto_ptr<cmCryptoHash>::~auto_ptr(&local_78);
          }
          else {
            iVar1 = strcmp(local_18,"SHA512");
            if (iVar1 == 0) {
              pcVar2 = (cmCryptoHash *)operator_new(0x10);
              cmCryptoHash(pcVar2,AlgoSHA512);
              ::cm::auto_ptr<cmCryptoHash>::auto_ptr(&local_88,pcVar2);
              local_80 = (cmCryptoHash *)
                         ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_88);
              ::cm::auto_ptr<cmCryptoHash>::auto_ptr
                        ((auto_ptr<cmCryptoHash> *)this,(auto_ptr_ref<cmCryptoHash>)local_80);
              ::cm::auto_ptr<cmCryptoHash>::~auto_ptr(&local_88);
            }
            else {
              iVar1 = strcmp(local_18,"SHA3_224");
              if (iVar1 == 0) {
                pcVar2 = (cmCryptoHash *)operator_new(0x10);
                cmCryptoHash(pcVar2,AlgoSHA3_224);
                ::cm::auto_ptr<cmCryptoHash>::auto_ptr(&local_98,pcVar2);
                local_90 = (cmCryptoHash *)
                           ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_98);
                ::cm::auto_ptr<cmCryptoHash>::auto_ptr
                          ((auto_ptr<cmCryptoHash> *)this,(auto_ptr_ref<cmCryptoHash>)local_90);
                ::cm::auto_ptr<cmCryptoHash>::~auto_ptr(&local_98);
              }
              else {
                iVar1 = strcmp(local_18,"SHA3_256");
                if (iVar1 == 0) {
                  pcVar2 = (cmCryptoHash *)operator_new(0x10);
                  cmCryptoHash(pcVar2,AlgoSHA3_256);
                  ::cm::auto_ptr<cmCryptoHash>::auto_ptr(&local_a8,pcVar2);
                  local_a0 = (cmCryptoHash *)
                             ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_a8);
                  ::cm::auto_ptr<cmCryptoHash>::auto_ptr
                            ((auto_ptr<cmCryptoHash> *)this,(auto_ptr_ref<cmCryptoHash>)local_a0);
                  ::cm::auto_ptr<cmCryptoHash>::~auto_ptr(&local_a8);
                }
                else {
                  iVar1 = strcmp(local_18,"SHA3_384");
                  if (iVar1 == 0) {
                    pcVar2 = (cmCryptoHash *)operator_new(0x10);
                    cmCryptoHash(pcVar2,AlgoSHA3_384);
                    ::cm::auto_ptr<cmCryptoHash>::auto_ptr(&local_b8,pcVar2);
                    local_b0 = (cmCryptoHash *)
                               ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_b8);
                    ::cm::auto_ptr<cmCryptoHash>::auto_ptr
                              ((auto_ptr<cmCryptoHash> *)this,(auto_ptr_ref<cmCryptoHash>)local_b0);
                    ::cm::auto_ptr<cmCryptoHash>::~auto_ptr(&local_b8);
                  }
                  else {
                    iVar1 = strcmp(local_18,"SHA3_512");
                    if (iVar1 == 0) {
                      pcVar2 = (cmCryptoHash *)operator_new(0x10);
                      cmCryptoHash(pcVar2,AlgoSHA3_512);
                      ::cm::auto_ptr<cmCryptoHash>::auto_ptr(&local_c8,pcVar2);
                      local_c0 = (cmCryptoHash *)
                                 ::cm::auto_ptr::operator_cast_to_auto_ptr_ref
                                           ((auto_ptr *)&local_c8);
                      ::cm::auto_ptr<cmCryptoHash>::auto_ptr
                                ((auto_ptr<cmCryptoHash> *)this,(auto_ptr_ref<cmCryptoHash>)local_c0
                                );
                      ::cm::auto_ptr<cmCryptoHash>::~auto_ptr(&local_c8);
                    }
                    else {
                      ::cm::auto_ptr<cmCryptoHash>::auto_ptr(&local_d8,(cmCryptoHash *)0x0);
                      local_d0 = (cmCryptoHash *)
                                 ::cm::auto_ptr::operator_cast_to_auto_ptr_ref
                                           ((auto_ptr *)&local_d8);
                      ::cm::auto_ptr<cmCryptoHash>::auto_ptr
                                ((auto_ptr<cmCryptoHash> *)this,(auto_ptr_ref<cmCryptoHash>)local_d0
                                );
                      ::cm::auto_ptr<cmCryptoHash>::~auto_ptr(&local_d8);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (auto_ptr<cmCryptoHash>)this;
}

Assistant:

CM_AUTO_PTR<cmCryptoHash> cmCryptoHash::New(const char* algo)
{
  if (strcmp(algo, "MD5") == 0) {
    return CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(AlgoMD5));
  }
  if (strcmp(algo, "SHA1") == 0) {
    return CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(AlgoSHA1));
  }
  if (strcmp(algo, "SHA224") == 0) {
    return CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(AlgoSHA224));
  }
  if (strcmp(algo, "SHA256") == 0) {
    return CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(AlgoSHA256));
  }
  if (strcmp(algo, "SHA384") == 0) {
    return CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(AlgoSHA384));
  }
  if (strcmp(algo, "SHA512") == 0) {
    return CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(AlgoSHA512));
  }
  if (strcmp(algo, "SHA3_224") == 0) {
    return CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(AlgoSHA3_224));
  }
  if (strcmp(algo, "SHA3_256") == 0) {
    return CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(AlgoSHA3_256));
  }
  if (strcmp(algo, "SHA3_384") == 0) {
    return CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(AlgoSHA3_384));
  }
  if (strcmp(algo, "SHA3_512") == 0) {
    return CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(AlgoSHA3_512));
  }
  return CM_AUTO_PTR<cmCryptoHash>(CM_NULLPTR);
}